

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httphandler.cpp
# Opt level: O2

void __thiscall HttpHandler::sendHeader(HttpHandler *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->response,"Content-Type: ");
  poVar1 = std::operator<<(poVar1,(string *)this->content_type);
  poVar1 = std::operator<<(poVar1,"\r\n");
  std::operator<<(poVar1,
                  "Cache-Control: no-cache, no-store, must-revalidate\r\nPragma: no-cache\r\nExpires: 0\r\nAccess-Control-Allow-Origin: *\r\n"
                 );
  if (this->encoding == Gzip) {
    std::operator<<(this->response,"Content-Encoding: gzip\r\n");
  }
  std::operator<<(this->response,"\r\n");
  return;
}

Assistant:

void HttpHandler::sendHeader()
{
    this->response << "Content-Type: " << *this->content_type << "\r\n"
                   << "Cache-Control: no-cache, no-store, must-revalidate\r\n"
                      "Pragma: no-cache\r\n"
                      "Expires: 0\r\n"
                      "Access-Control-Allow-Origin: *\r\n";

#if BROTLI_SUPPORT == 1
    if (this->encoding == Encoding::Brotli)
    {
        this->response << "Content-Encoding: br\r\n";
    }
    else
#endif
    if (this->encoding == Encoding::Gzip)
    {
        this->response << "Content-Encoding: gzip\r\n";
    }

    this->response << "\r\n";
}